

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::build
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  Scene *pSVar5;
  GTypeMask GVar6;
  BVHN<4> *this_00;
  BuildRef *pBVar7;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *pBVar8;
  MemoryMonitorInterface *pMVar9;
  pointer ppTVar10;
  int iVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  char cVar17;
  size_t i;
  BuildRef *pBVar18;
  long lVar19;
  NodeRefPtr<4> root;
  runtime_error *prVar20;
  uint uVar21;
  size_t i_1;
  ulong uVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *bounds;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *pBVar23;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *pBVar24;
  BVH *pBVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  pointer ppTVar29;
  size_t sVar30;
  size_t numPrimitives;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *pBVar31;
  anon_class_1_0_00000001 local_1b9;
  ulong local_1b8;
  double local_1b0;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  blocked_range<unsigned_long> local_d0;
  PrimInfo pinfo;
  anon_class_8_1_8991fb9c local_60;
  anon_class_16_2_ed117de8_conflict33 local_58;
  anon_class_24_3_8ee612a4_conflict4 local_48;
  
  pBVar25 = this->bvh;
  uVar22 = (this->scene->geometries).size_active;
  uVar26 = (long)(pBVar25->objects).
                 super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pBVar25->objects).
                 super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if (uVar22 < uVar26) {
    local_d0.my_end = (unsigned_long)this;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
    local_128._0_8_ = &local_d0;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar26;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar22;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
               &context);
    cVar17 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar17 != '\0') {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar20,"task cancelled");
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    pBVar25 = this->bvh;
  }
  FastAllocator::reset(&pBVar25->alloc);
  pSVar5 = this->scene;
  GVar6 = this->gtype;
  uVar21 = (uint)GVar6;
  if ((uVar21 >> 0x14 & 1) == 0) {
    numPrimitives = 0;
  }
  else {
    numPrimitives = (pSVar5->world).numTriangles;
  }
  if ((uVar21 >> 0x15 & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numQuads;
  }
  if ((GVar6 & MTY_CURVE2) != ~MTY_ALL) {
    numPrimitives = numPrimitives + (pSVar5->world).numLineSegments;
  }
  if ((GVar6 & MTY_CURVE4) != ~MTY_ALL) {
    numPrimitives = numPrimitives + (pSVar5->world).numBezierCurves;
  }
  if ((GVar6 & MTY_POINTS) != ~MTY_ALL) {
    numPrimitives = numPrimitives + (pSVar5->world).numPoints;
  }
  if ((uVar21 >> 0x17 & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numSubdivPatches;
  }
  if ((uVar21 >> 0x1d & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numUserGeometries;
  }
  if ((uVar21 >> 0x1e & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numInstancesCheap;
  }
  if ((int)uVar21 < 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numInstancesExpensive;
  }
  if ((uVar21 >> 0x18 & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numInstanceArrays;
  }
  if ((uVar21 >> 0x16 & 1) != 0) {
    numPrimitives = numPrimitives + (pSVar5->world).numGrids;
  }
  if (numPrimitives == 0) {
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    (this->prims).size_active = 0;
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&context,0);
    return;
  }
  dVar12 = (double)(numPrimitives + 3 >> 2) * 1.2 * 176.0;
  uVar26 = (ulong)dVar12;
  FastAllocator::init_estimate
            (&this->bvh->alloc,
             ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26) +
             (numPrimitives + 3 & 0x3fffffffffffffc) * 0x10);
  this_00 = this->bvh;
  std::__cxx11::to_string((string *)&local_128.field_1,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "sse2::BVH",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_128.field_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "BuilderTwoLevel");
  local_1b0 = BVHN<4>::preBuild(this_00,(string *)&context);
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&pinfo);
  std::__cxx11::string::~string((string *)&local_128.field_1);
  pBVar25 = this->bvh;
  if ((ulong)((long)(pBVar25->objects).
                    super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar25->objects).
                    super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar22) {
    std::vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>::resize
              (&pBVar25->objects,uVar22);
  }
  if ((ulong)((long)(this->builders).
                    super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->builders).
                    super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar22) {
    std::
    vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
    ::resize(&this->builders,uVar22);
  }
  resizeRefsList(this);
  LOCK();
  (this->nextRef).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  local_d0.my_end = (unsigned_long)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = 0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
  local_128._0_8_ = &local_d0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar22;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_2_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
             &context);
  cVar17 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar17 != '\0') {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"task cancelled");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  local_d0.my_end = (unsigned_long)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = 0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
  local_128._0_8_ = &local_d0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar22;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_3_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::range<unsigned_long>const&)_3_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
             &context);
  cVar17 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar17 != '\0') {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"task cancelled");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if ((this->nextRef).super___atomic_base<int>._M_i == 1) {
    pBVar25 = this->bvh;
    pBVar7 = (this->refs).items;
    root.ptr = (pBVar7->node).ptr;
    context.my_cpu_ctl_env = *(uint64_t *)&(pBVar7->super_PrimRef).lower.field_0;
    context._8_8_ = *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + 8);
    context.field_6 =
         *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
          &(pBVar7->super_PrimRef).upper.field_0;
    context.my_context_list = *(context_list **)((long)&(pBVar7->super_PrimRef).upper.field_0 + 8);
    bounds = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&context;
    context.my_node.my_prev_node = (intrusive_list_node *)context.my_cpu_ctl_env;
    context.my_node.my_next_node = (intrusive_list_node *)context._8_8_;
    context.my_exception._M_b._M_p = (__base_type)(__base_type)context.field_6;
    context.my_itt_caller = context.my_context_list;
    goto LAB_0050a8b5;
  }
  pBVar31 = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)
            (long)(this->nextRef).super___atomic_base<int>._M_i;
  pBVar8 = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)
           (this->refs).size_alloced;
  pBVar24 = pBVar8;
  if ((pBVar8 < pBVar31) &&
     (pBVar23 = pBVar8, pBVar24 = pBVar31,
     pBVar8 != (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)0x0)) {
    for (; pBVar24 = pBVar23, pBVar23 < pBVar31;
        pBVar23 = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)
                  ((long)pBVar23 * 2 + (ulong)((long)pBVar23 * 2 == 0))) {
    }
  }
  if (pBVar31 < (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)
                (this->refs).size_active) {
    (this->refs).size_active = (size_t)pBVar31;
  }
  if (pBVar8 == pBVar24) {
    (this->refs).size_active = (size_t)pBVar31;
  }
  else {
    pBVar7 = (this->refs).items;
    if (pBVar24 == (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)0x0) {
      sVar30 = 0;
LAB_0050a4b7:
      pBVar18 = (BuildRef *)alignedMalloc(sVar30,0x20);
    }
    else {
      pMVar9 = (this->refs).alloc.device;
      sVar30 = (long)pBVar24 << 6;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30,0);
      if (sVar30 < 0x1c00000) goto LAB_0050a4b7;
      pBVar18 = (BuildRef *)os_malloc(sVar30,&(this->refs).alloc.hugepages);
    }
    lVar19 = 0x20;
    (this->refs).items = pBVar18;
    for (uVar22 = 0; uVar22 < (this->refs).size_active; uVar22 = uVar22 + 1) {
      pBVar18 = (this->refs).items;
      puVar1 = (undefined8 *)((long)pBVar7 + lVar19 + -0x20);
      uVar16 = puVar1[1];
      puVar2 = (undefined8 *)((long)pBVar18 + lVar19 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar16;
      puVar1 = (undefined8 *)((long)pBVar7 + lVar19 + -0x10);
      uVar16 = puVar1[1];
      puVar2 = (undefined8 *)((long)pBVar18 + lVar19 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar16;
      *(undefined8 *)((long)&(pBVar18->super_PrimRef).lower.field_0 + lVar19) =
           *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar19);
      *(undefined4 *)((long)&(pBVar18->super_PrimRef).lower.field_0 + lVar19 + 8) =
           *(undefined4 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar19 + 8);
      lVar19 = lVar19 + 0x40;
    }
    sVar30 = (this->refs).size_alloced;
    if (pBVar7 != (BuildRef *)0x0) {
      if (sVar30 << 6 < 0x1c00000) {
        alignedFree(pBVar7);
      }
      else {
        os_free(pBVar7,sVar30 << 6,(this->refs).alloc.hugepages);
      }
    }
    if (sVar30 != 0) {
      pMVar9 = (this->refs).alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x40,1);
    }
    (this->refs).size_active = (size_t)pBVar31;
    (this->refs).size_alloced = (size_t)pBVar24;
  }
  uVar22 = (ulong)((float)numPrimitives / 1000.0);
  uVar22 = (long)((float)numPrimitives / 1000.0 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22;
  if (uVar22 < (ulong)((long)pBVar31 * 2)) {
    uVar22 = (long)pBVar31 * 2;
  }
  local_1b8 = 1000;
  if (1000 < uVar22) {
    local_1b8 = uVar22;
  }
  local_128._0_8_ = (blocked_range<unsigned_long> *)0x7f8000007f800000;
  local_128._8_8_ = 0x7f8000007f800000;
  local_118 = 0xff800000ff800000;
  uStack_110 = 0xff800000ff800000;
  local_108 = 0x7f8000007f800000;
  uStack_100 = 0x7f8000007f800000;
  local_f8 = 0xff800000ff800000;
  uStack_f0 = 0xff800000ff800000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_48.func = &local_60;
  local_48.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_128;
  local_60.this = this;
  local_48.reduction = &local_1b9;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 1;
  local_d0.my_end = (unsigned_long)pBVar31;
  local_58.reduction = &local_1b9;
  local_58.func = &local_48;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_twolevel_cpp:146:16)>
            (&pinfo,&local_d0,(PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_128.field_1,
             &local_58,&local_1b9,&context);
  cVar17 = tbb::detail::r1::is_group_execution_cancelled(&context);
  uVar22 = local_1b8;
  if (cVar17 != '\0') {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"task cancelled");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if (pinfo.end == pinfo.begin) {
    pBVar25 = this->bvh;
    bounds = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&context;
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    root.ptr = 8;
    numPrimitives = 0;
  }
  else {
    context.my_itt_caller = (void *)0xffffffffffffffff;
    context.my_cpu_ctl_env = 4;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x28;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0;
    context.my_lifetime_state._M_i = created;
    for (iVar11 = 0x1f; 4U >> iVar11 == 0; iVar11 = iVar11 + -1) {
    }
    context.field_6 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(long)iVar11;
    context.my_context_list = (context_list *)0x1;
    context.my_node.my_prev_node = (intrusive_list_node *)0x1;
    context.my_node.my_next_node = (intrusive_list_node *)0x3f8000003f800000;
    context.my_exception._M_b._M_p = (__base_type)this->singleThreadThreshold;
    uVar26 = (this->refs).size_alloced;
    uVar28 = uVar26;
    if ((uVar26 < uVar22) && (uVar27 = uVar26, uVar28 = uVar22, uVar26 != 0)) {
      for (; uVar28 = uVar27, uVar27 < uVar22; uVar27 = uVar27 * 2 + (ulong)(uVar27 * 2 == 0)) {
      }
    }
    if (uVar22 < (this->refs).size_active) {
      (this->refs).size_active = uVar22;
    }
    if (uVar26 == uVar28) {
      (this->refs).size_active = uVar22;
    }
    else {
      pMVar9 = (this->refs).alloc.device;
      pBVar7 = (this->refs).items;
      uVar22 = uVar28 << 6;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar22,0);
      if (uVar22 < 0x1c00000) {
        pBVar18 = (BuildRef *)alignedMalloc(uVar22,0x20);
      }
      else {
        pBVar18 = (BuildRef *)os_malloc(uVar22,&(this->refs).alloc.hugepages);
      }
      (this->refs).items = pBVar18;
      lVar19 = 0x20;
      for (uVar22 = 0; uVar22 < (this->refs).size_active; uVar22 = uVar22 + 1) {
        pBVar18 = (this->refs).items;
        puVar1 = (undefined8 *)((long)pBVar7 + lVar19 + -0x20);
        uVar16 = puVar1[1];
        puVar2 = (undefined8 *)((long)pBVar18 + lVar19 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar16;
        puVar3 = (undefined4 *)((long)pBVar7 + lVar19 + -0x10);
        uVar13 = puVar3[1];
        uVar14 = puVar3[2];
        uVar15 = puVar3[3];
        puVar4 = (undefined4 *)((long)pBVar18 + lVar19 + -0x10);
        *puVar4 = *puVar3;
        puVar4[1] = uVar13;
        puVar4[2] = uVar14;
        puVar4[3] = uVar15;
        *(undefined8 *)((long)&(pBVar18->super_PrimRef).lower.field_0 + lVar19) =
             *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar19);
        *(undefined4 *)((long)&(pBVar18->super_PrimRef).lower.field_0 + lVar19 + 8) =
             *(undefined4 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar19 + 8);
        lVar19 = lVar19 + 0x40;
      }
      sVar30 = (this->refs).size_alloced;
      if (pBVar7 != (BuildRef *)0x0) {
        if (sVar30 << 6 < 0x1c00000) {
          alignedFree(pBVar7);
        }
        else {
          os_free(pBVar7,sVar30 << 6,(this->refs).alloc.hugepages);
        }
      }
      if (sVar30 != 0) {
        pMVar9 = (this->refs).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x40,1);
      }
      (this->refs).size_active = local_1b8;
      (this->refs).size_alloced = uVar28;
      uVar22 = local_1b8;
    }
    root = BVHBuilderBinnedOpenMergeSAH::
           build<embree::NodeRefPtr<4>,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef&,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef*)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(unsigned_long)_1_>
                     (&this->bvh->alloc,&local_128,this,this,(this->refs).items,uVar22,&pinfo,
                      &context);
    pBVar25 = this->bvh;
    local_128._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_128._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_118 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_110 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_108 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    uStack_100 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_f8 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_f0 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    bounds = &local_128;
  }
LAB_0050a8b5:
  BVHN<4>::set(pBVar25,(NodeRef)root.ptr,(LBBox3fa *)&bounds->field_1,numPrimitives);
  pBVar25 = this->bvh;
  FastAllocator::internal_fix_used_blocks(&pBVar25->alloc);
  ppTVar10 = (pBVar25->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar29 = (pBVar25->alloc).thread_local_allocators.
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar29 != ppTVar10;
      ppTVar29 = ppTVar29 + 1) {
    FastAllocator::ThreadLocal2::unbind(*ppTVar29,&pBVar25->alloc);
  }
  ppTVar29 = (pBVar25->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pBVar25->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar29) {
    (pBVar25->alloc).thread_local_allocators.
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar29;
  }
  BVHN<4>::postBuild(this->bvh,local_1b0);
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::build()
    {
      /* delete some objects */
      size_t num = scene->size();
      if (num < bvh->objects.size()) {
        parallel_for(num, bvh->objects.size(), [&] (const range<size_t>& r) {
            for (size_t i=r.begin(); i<r.end(); i++) {
              builders[i].reset();
              delete bvh->objects[i]; bvh->objects[i] = nullptr;
            }
          });
      }
      
#if PROFILE
      while(1) 
#endif
      {
      /* reset memory allocator */
      bvh->alloc.reset();
      
      /* skip build for empty scene */
      const size_t numPrimitives = scene->getNumPrimitives(gtype,false);

      if (numPrimitives == 0) {
        prims.resize(0);
        bvh->set(BVH::emptyNode,empty,0);
        return;
      }

      /* calculate the size of the entire BVH */
      const size_t numLeafBlocks = Primitive::blocks(numPrimitives);
      const size_t node_bytes = 2*numLeafBlocks*sizeof(typename BVH::AABBNode)/N;
      const size_t leaf_bytes = size_t(1.2*numLeafBlocks*sizeof(Primitive));
      bvh->alloc.init_estimate(node_bytes+leaf_bytes); 

      double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderTwoLevel");

      /* resize object array if scene got larger */
      if (bvh->objects.size()  < num) bvh->objects.resize(num);
      if (builders.size() < num) builders.resize(num);
      resizeRefsList ();
      nextRef.store(0);
      
      /* create acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
      
          /* ignore meshes we do not support */
          if (mesh == nullptr || mesh->numTimeSteps != 1)
            continue;
          
          if (isSmallGeometry(mesh)) {
             setupSmallBuildRefBuilder (objectID, mesh);
          } else {
            setupLargeBuildRefBuilder (objectID, mesh);
          }
        }
      });

      /* parallel build of acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          /* ignore if no triangle mesh or not enabled */
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
          if (mesh == nullptr || !mesh->isEnabled() || mesh->numTimeSteps != 1) 
            continue;

          builders[objectID]->attachBuildRefs (this);
        }
      });


#if PROFILE
      double d0 = getSeconds();
#endif
      /* fast path for single geometry scenes */
      if (nextRef == 1) { 
        bvh->set(refs[0].node,LBBox3fa(refs[0].bounds()),numPrimitives);
      }

      else
      {     
        /* open all large nodes */
        refs.resize(nextRef);

        /* this probably needs some more tuning */
        const size_t extSize = max(max((size_t)SPLIT_MIN_EXT_SPACE,refs.size()*SPLIT_MEMORY_RESERVE_SCALE),size_t((float)numPrimitives / SPLIT_MEMORY_RESERVE_FACTOR));
 
#if !ENABLE_DIRECT_SAH_MERGE_BUILDER

#if ENABLE_OPEN_SEQUENTIAL
        open_sequential(extSize); 
#endif
        /* compute PrimRefs */
        prims.resize(refs.size());
#endif
        
        {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER

          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
          
#else
          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
                prims[i] = PrimRef(refs[i].bounds(),(size_t)refs[i].node);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
#endif   
       
          /* skip if all objects where empty */
          if (pinfo.size() == 0)
            bvh->set(BVH::emptyNode,empty,0);
        
          /* otherwise build toplevel hierarchy */
          else
          {
            /* settings for BVH build */
            GeneralBVHBuilder::Settings settings;
            settings.branchingFactor = N;
            settings.maxDepth = BVH::maxBuildDepthLeaf;
            settings.logBlockSize = bsr(N);
            settings.minLeafSize = 1;
            settings.maxLeafSize = 1;
            settings.travCost = 1.0f;
            settings.intCost = 1.0f;
            settings.singleThreadThreshold = singleThreadThreshold;
      
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            
            refs.resize(extSize); 
         
            NodeRef root = BVHBuilderBinnedOpenMergeSAH::build<NodeRef,BuildRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const BuildRef* refs, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef  {
                assert(range.size() == 1);
                return (NodeRef) refs[range.begin()].node;
              },
              [&] (BuildRef &bref, BuildRef *refs) -> size_t { 
                return openBuildRef(bref,refs);
              },              
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              refs.data(),extSize,pinfo,settings);
#else
            NodeRef root = BVHBuilderBinnedSAH::build<NodeRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const PrimRef* prims, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
                assert(range.size() == 1);
                return (NodeRef) prims[range.begin()].ID();
              },
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              prims.data(),pinfo,settings);
#endif

            
            bvh->set(root,LBBox3fa(pinfo.geomBounds),numPrimitives);
          }
        }
      }  
        
      bvh->alloc.cleanup();
      bvh->postBuild(t0);
#if PROFILE
      double d1 = getSeconds();
      std::cout << "TOP_LEVEL OPENING/REBUILD TIME " << 1000.0*(d1-d0) << " ms" << std::endl;
#endif
      }

    }
    
    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::open_sequential(const size_t extSize)
    {
      if (refs.size() == 0)
	return;

      refs.reserve(extSize);

#if 1
      for (size_t i=0;i<refs.size();i++)
      {
        NodeRef ref = refs[i].node;
        if (ref.isAABBNode())
          BVH::prefetch(ref);
      }
#endif

      std::make_heap(refs.begin(),refs.end());
      while (refs.size()+N-1 <= extSize)
      {
        std::pop_heap (refs.begin(),refs.end()); 
        NodeRef ref = refs.back().node;
        if (ref.isLeaf()) break;
        refs.pop_back();    
        
        AABBNode* node = ref.getAABBNode();
        for (size_t i=0; i<N; i++) {
          if (node->child(i) == BVH::emptyNode) continue;
          refs.push_back(BuildRef(node->bounds(i),node->child(i)));
         
#if 1
          NodeRef ref_pre = node->child(i);
          if (ref_pre.isAABBNode())
            ref_pre.prefetch();
#endif
          std::push_heap (refs.begin(),refs.end()); 
        }
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }

#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH4BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4v>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4i>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH4BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,QuadMesh,Quad4v>((BVH4*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH4BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,UserGeometry,Object>((BVH4*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH4BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,Instance,InstancePrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH4BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,InstanceArray,InstanceArrayPrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(__AVX__)
#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4v>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4i>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH8BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,QuadMesh,Quad4v>((BVH8*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH8BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,UserGeometry,Object>((BVH8*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH8BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,Instance,InstancePrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH8BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,InstanceArray,InstanceArrayPrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#endif
  }